

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

int remove_periodic_task(select_data_ptr sd,periodic_task_handle_conflict handle)

{
  pthread_t pVar1;
  pthread_t pVar2;
  void *in_RSI;
  long in_RDI;
  int i;
  periodic_task_handle_conflict last;
  periodic_task_handle_conflict list;
  void *local_28;
  void *local_20;
  
  local_28 = (void *)0x0;
  local_20 = *(void **)(in_RDI + 0x20);
  do {
    if (local_20 == in_RSI) {
      if (local_28 == (void *)0x0) {
        *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)((long)local_20 + 0x38);
      }
      else {
        *(undefined8 *)((long)local_28 + 0x38) = *(undefined8 *)((long)local_20 + 0x38);
      }
      pVar1 = *(pthread_t *)((long)in_RSI + 8);
      pVar2 = pthread_self();
      if (pVar1 != pVar2) {
        while (*(long *)((long)in_RSI + 8) != -1) {
          sched_yield();
        }
      }
      free(in_RSI);
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
      return 1;
    }
    local_28 = local_20;
    local_20 = *(void **)((long)local_20 + 0x38);
  } while (local_20 != (void *)0x0);
  return 0;
}

Assistant:

static int
remove_periodic_task(select_data_ptr sd, periodic_task_handle handle)
{
    periodic_task_handle list, last = NULL;
    list = sd->periodic_task_list;
    
    while(list != handle) {
	last = list;
	list = list->next;
	if (list == NULL) {
	    return 0;
	}
    }
    /* unlink task */
    if (last == NULL) {
	sd->periodic_task_list = list->next;
    } else {
	last->next = list->next;
    }
    if (handle->executing != thr_thread_self()) {
	/* someone besides us executing this ? */
        int i = 0;
	while (handle->executing != (thr_thread_t)-1) {
	    /* wait until they're done */
	    thr_thread_yield();
	    i++;
	    if (i > 1000) {
	        /* give up */
	        continue;
	    }
	}
    }
    free(handle);
    sd->select_consistency_number++;
    return 1;
}